

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O2

void __thiscall
TasGrid::TasmanianSparseGrid::setSurplusRefinement
          (TasmanianSparseGrid *this,double tolerance,TypeRefinement criteria,int output,
          vector<int,_std::allocator<int>_> *level_limits,
          vector<double,_std::allocator<double>_> *scale_correction)

{
  BaseCanonicalGrid *pBVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  invalid_argument *this_00;
  code *pcVar5;
  undefined *puVar6;
  pointer pdVar7;
  pointer scale_correction_00;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if (pBVar1 == (BaseCanonicalGrid *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              ((runtime_error *)this_00,
               "ERROR: calling setSurplusRefinement() for a grid that has not been initialized");
    puVar6 = &::std::runtime_error::typeinfo;
    pcVar5 = ::std::runtime_error::~runtime_error;
  }
  else {
    lVar4 = (long)(pBVar1->needed).cache_num_indexes;
    if (output != -1) {
      lVar4 = lVar4 * pBVar1->num_outputs;
    }
    piVar2 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((piVar2 == piVar3) || ((long)piVar3 - (long)piVar2 >> 2 == (long)pBVar1->num_dimensions)) {
      scale_correction_00 =
           (scale_correction->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
      pdVar7 = (scale_correction->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((scale_correction_00 == pdVar7) ||
         ((long)pdVar7 - (long)scale_correction_00 >> 3 == lVar4)) {
        if (piVar2 != piVar3) {
          ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
          scale_correction_00 =
               (scale_correction->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
          pdVar7 = (scale_correction->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        if (scale_correction_00 == pdVar7) {
          scale_correction_00 = (double *)0x0;
        }
        setSurplusRefinement(this,tolerance,criteria,output,(int *)0x0,scale_correction_00);
        return;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (this_00,"ERROR: setSurplusRefinement() incorrect size for scale_correction");
    }
    else {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (this_00,
                 "ERROR: setSurplusRefinement() requires level_limits with either 0 or dimenions entries"
                );
    }
    puVar6 = &::std::invalid_argument::typeinfo;
    pcVar5 = ::std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar6,pcVar5);
}

Assistant:

void TasmanianSparseGrid::setSurplusRefinement(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits, const std::vector<double> &scale_correction){
    if (empty()) throw std::runtime_error("ERROR: calling setSurplusRefinement() for a grid that has not been initialized");
    int dims = base->getNumDimensions();
    size_t nscale = (size_t) base->getNumNeeded();
    if (output != -1) nscale *= (size_t) base->getNumOutputs();
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dims)) throw std::invalid_argument("ERROR: setSurplusRefinement() requires level_limits with either 0 or dimenions entries");
    if ((!scale_correction.empty()) && (scale_correction.size() != nscale)) throw std::invalid_argument("ERROR: setSurplusRefinement() incorrect size for scale_correction");

    if (!level_limits.empty()) llimits = level_limits;
    setSurplusRefinement(tolerance, criteria, output, nullptr, (scale_correction.empty()) ? nullptr : scale_correction.data());
}